

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void generate_exception(DisasContext_conflict12 *ctx,int excp)

{
  TCGContext_conflict11 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),
                      (ctx->base).pc_next);
  pTVar1 = tcg_const_i32_riscv64(tcg_ctx,excp);
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_30 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_riscv64(tcg_ctx,helper_raise_exception_riscv64,(TCGTemp *)0x0,2,&local_38);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static inline void generate_exception(DisasContext *ctx, int excp)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_0e0i(raise_exception, excp);
}